

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O0

int afm_compare_kern_pairs(void *a,void *b)

{
  ulong uVar1;
  ulong uVar2;
  FT_ULong index2;
  FT_ULong index1;
  AFM_KernPair kp2;
  AFM_KernPair kp1;
  void *b_local;
  void *a_local;
  
  uVar1 = (ulong)*a << 0x10 | (ulong)*(uint *)((long)a + 4);
  uVar2 = (ulong)*b << 0x10 | (ulong)*(uint *)((long)b + 4);
  if (uVar2 < uVar1) {
    a_local._4_4_ = 1;
  }
  else if (uVar1 < uVar2) {
    a_local._4_4_ = -1;
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

FT_CALLBACK_DEF( int )
  afm_compare_kern_pairs( const void*  a,
                          const void*  b )
  {
    AFM_KernPair  kp1 = (AFM_KernPair)a;
    AFM_KernPair  kp2 = (AFM_KernPair)b;

    FT_ULong  index1 = KERN_INDEX( kp1->index1, kp1->index2 );
    FT_ULong  index2 = KERN_INDEX( kp2->index1, kp2->index2 );


    if ( index1 > index2 )
      return 1;
    else if ( index1 < index2 )
      return -1;
    else
      return 0;
  }